

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  long lVar4;
  anon_struct_56_7_ac49a46d gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 7;
  puStack_30 = (undefined1 *)&local_98;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_98 = sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x18) = sVar3;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_98 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  sStack_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_98 + 0x28),
                         (context->roots).receiverTypeInferenceType,arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x28) = sStack_90;
  if (*(sysbvm_tuple_t *)(local_98 + 0x30) == 0) {
    if (*(long *)(local_98 + 0x40) == 0) {
      sysbvm_error("A name or bound slot is required.");
    }
  }
  else {
    local_88 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_98 + 0x30),(context->roots).symbolType,
                          arguments[1]);
    *(sysbvm_tuple_t *)(local_98 + 0x30) = local_88;
    _Var2 = sysbvm_astNode_isLiteralNode(context,local_88);
    if (!_Var2) {
      sysbvm_error("Expected a literal slot name.");
    }
    local_78 = sysbvm_astLiteralNode_getValue(local_88);
    if ((sStack_90 & 0xf) == 0 && sStack_90 != 0) {
      sStack_80 = *(sysbvm_tuple_t *)(sStack_90 + 0x20);
    }
    else {
      sStack_80 = 0;
    }
    if (sStack_80 == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:4341: assertion failure: gcFrame.analyzedTupleExpressionType"
                );
    }
    sStack_70 = sysbvm_type_lookupSlot(context,sStack_80,local_78);
    if (sStack_70 == 0) {
      sysbvm_error("Type does not have a slot with the specified name.");
    }
    *(sysbvm_tuple_t *)(local_98 + 0x40) = sStack_70;
  }
  uVar1 = *(ulong *)(local_98 + 0x40);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    lVar4 = *(long *)(uVar1 + 0x30);
  }
  else {
    lVar4 = 0;
  }
  *(long *)(local_98 + 0x20) = lVar4;
  if (lVar4 == 0) {
    *(sysbvm_tuple_t *)(local_98 + 0x20) = (context->roots).anyValueType;
  }
  local_68 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,*(sysbvm_tuple_t *)(local_98 + 0x38),
                        *(sysbvm_tuple_t *)(local_98 + 0x20),arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x38) = local_68;
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_98;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astTupleSlotNamedAtPutNode_t *tupleSlotNamedAtPutNode;
        sysbvm_tuple_t analyzedTupleExpression;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t analyzedTupleExpressionType;
        sysbvm_tuple_t slotName;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t analyzedValueExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.tupleSlotNamedAtPutNode = (sysbvm_astTupleSlotNamedAtPutNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.tupleSlotNamedAtPutNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.tupleSlotNamedAtPutNode->super.sourcePosition);

    gcFrame.analyzedTupleExpression = sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtPutNode->tupleExpression, *environment);
    gcFrame.tupleSlotNamedAtPutNode->tupleExpression = gcFrame.analyzedTupleExpression;

    if(gcFrame.tupleSlotNamedAtPutNode->nameExpression)
    {
        gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtPutNode->nameExpression, context->roots.symbolType, *environment);
        gcFrame.tupleSlotNamedAtPutNode->nameExpression = gcFrame.analyzedNameExpression;
        if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
            sysbvm_error("Expected a literal slot name.");

        gcFrame.slotName = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);

        gcFrame.analyzedTupleExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTupleExpression);
        SYSBVM_ASSERT(gcFrame.analyzedTupleExpressionType);

        gcFrame.slot = sysbvm_type_lookupSlot(context, gcFrame.analyzedTupleExpressionType, gcFrame.slotName);
        if(!gcFrame.slot)
            sysbvm_error("Type does not have a slot with the specified name.");

        gcFrame.tupleSlotNamedAtPutNode->boundSlot = gcFrame.slot;
    }
    else
    {
        if(!gcFrame.tupleSlotNamedAtPutNode->boundSlot)
            sysbvm_error("A name or bound slot is required.");
    }

    gcFrame.tupleSlotNamedAtPutNode->super.analyzedType = sysbvm_typeSlot_getType(gcFrame.tupleSlotNamedAtPutNode->boundSlot);
    if(!gcFrame.tupleSlotNamedAtPutNode->super.analyzedType)
        gcFrame.tupleSlotNamedAtPutNode->super.analyzedType = context->roots.anyValueType;

    gcFrame.analyzedValueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtPutNode->valueExpression, gcFrame.tupleSlotNamedAtPutNode->super.analyzedType, *environment);
    gcFrame.tupleSlotNamedAtPutNode->valueExpression = gcFrame.analyzedValueExpression;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.tupleSlotNamedAtPutNode;
}